

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O2

int Extra_ThreshInitializeChow(int nVars,int *pChow)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int Aux [16];
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar3 = uVar2;
  }
  iVar1 = 0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    if (uVar2 != 0) {
      iVar1 = iVar1 + (uint)(pChow[uVar2] != pChow[uVar2 - 1]);
    }
    Aux[uVar2] = iVar1;
  }
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    pChow[uVar2] = Aux[uVar2];
  }
  return iVar1 + 1;
}

Assistant:

int Extra_ThreshInitializeChow(int nVars, int * pChow) {
    int i = 0, Aux[16], nChows = 0;
    //group the variables which have the same Chow
    for (i = 0; i < nVars; i++) {
        if (i == 0 || (pChow[i] == pChow[i - 1]))
            Aux[i] = nChows;
        else {
            nChows++;
            Aux[i] = nChows;
        }
    }
    for (i = 0; i < nVars; i++)
        pChow[i] = Aux[i];
    nChows++;
    return nChows;

}